

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall chrono::fea::ChLoadXYZROTnode::~ChLoadXYZROTnode(ChLoadXYZROTnode *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class ChApi ChLoadXYZROTnode : public ChLoadCustom {
  public:
    ChLoadXYZROTnode(std::shared_ptr<ChNodeFEAxyzrot> body  ///< node to apply load to
    );

    /// Compute the force and torque on the node, in absolute coordsystem,
    /// given absolute position and speed of node passed via node_frame_abs_pos_vel.
    /// Inherited classes MUST IMPLEMENT THIS.
    virtual void ComputeForceTorque(const ChFrameMoving<>& node_frame_abs_pos_vel,
                                    ChVector<>& abs_force,
                                    ChVector<>& abs_torque) = 0;

    // Optional: inherited classes could implement this to avoid the
    // default numerical computation of jacobians:
    //   virtual void ComputeJacobian(...) // see ChLoad

    /// Compute Q, the generalized load.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;

    /// For diagnosis purposes, this can return the actual last computed value of
    /// the applied force, expressed in absolute coordinate system, assumed applied to node
    ChVector<> GetForce() const { return computed_abs_force; }

    /// For diagnosis purposes, this can return the actual last computed value of
    /// the applied torque, expressed in absolute coordinate system, assumed applied to node
    ChVector<> GetTorque() const { return computed_abs_torque; }

  protected:
    /// Inherited classes could override this and return true, if the load benefits from a jacobian
    /// when using implicit integrators.
    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;

    ChVector<> computed_abs_force;
    ChVector<> computed_abs_torque;
}